

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O2

void GlobOpt::AssertCanCopyPropOrCSEFieldLoad(Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  OpCode OVar3;
  undefined4 *puVar4;
  JITTimeFunctionBody *pJVar5;
  SymOpnd *pSVar6;
  
  OVar3 = instr->m_opcode;
  if ((((0x2e < OVar3 - 0x5e) || ((0x40c000015501U >> ((ulong)(OVar3 - 0x5e) & 0x3f) & 1) == 0)) &&
      ((0x10 < OVar3 - 0x121 || ((0x10005U >> (OVar3 - 0x121 & 0x1f) & 1) == 0)))) &&
     ((((2 < OVar3 - 500 && (OVar3 != LdLen_A)) && (OVar3 != CheckFixedFld)) &&
      (OVar3 != CheckPropertyGuardAndLoadType)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x2db,
                       "(instr->m_opcode == Js::OpCode::LdSlot || instr->m_opcode == Js::OpCode::LdSlotArr || instr->m_opcode == Js::OpCode::LdFld || instr->m_opcode == Js::OpCode::LdFldForCallApplyTarget || instr->m_opcode == Js::OpCode::LdLen_A || instr->m_opcode == Js::OpCode::LdRootFld || instr->m_opcode == Js::OpCode::LdSuperFld || instr->m_opcode == Js::OpCode::LdFldForTypeOf || instr->m_opcode == Js::OpCode::LdRootFldForTypeOf || instr->m_opcode == Js::OpCode::LdMethodFld || instr->m_opcode == Js::OpCode::LdMethodFldPolyInlineMiss || instr->m_opcode == Js::OpCode::LdRootMethodFld || instr->m_opcode == Js::OpCode::LdMethodFromFlags || instr->m_opcode == Js::OpCode::ScopedLdMethodFld || instr->m_opcode == Js::OpCode::CheckFixedFld || instr->m_opcode == Js::OpCode::CheckPropertyGuardAndLoadType || instr->m_opcode == Js::OpCode::ScopedLdFld || instr->m_opcode == Js::OpCode::ScopedLdFldForTypeOf)"
                       ,
                       "instr->m_opcode == Js::OpCode::LdSlot || instr->m_opcode == Js::OpCode::LdSlotArr || instr->m_opcode == Js::OpCode::LdFld || instr->m_opcode == Js::OpCode::LdFldForCallApplyTarget || instr->m_opcode == Js::OpCode::LdLen_A || instr->m_opcode == Js::OpCode::LdRootFld || instr->m_opcode == Js::OpCode::LdSuperFld || instr->m_opcode == Js::OpCode::LdFldForTypeOf || instr->m_opcode == Js::OpCode::LdRootFldForTypeOf || instr->m_opcode == Js::OpCode::LdMethodFld || instr->m_opcode == Js::OpCode::LdMethodFldPolyInlineMiss || instr->m_opcode == Js::OpCode::LdRootMethodFld || instr->m_opcode == Js::OpCode::LdMethodFromFlags || instr->m_opcode == Js::OpCode::ScopedLdMethodFld || instr->m_opcode == Js::OpCode::CheckFixedFld || instr->m_opcode == Js::OpCode::CheckPropertyGuardAndLoadType || instr->m_opcode == Js::OpCode::ScopedLdFld || instr->m_opcode == Js::OpCode::ScopedLdFldForTypeOf"
                      );
    if (!bVar2) goto LAB_0046b58e;
    *puVar4 = 0;
    OVar3 = instr->m_opcode;
  }
  if ((OVar3 != CheckFixedFld) && (instr->m_dst->m_type != TyVar)) {
    pJVar5 = Func::GetJITFunctionBody(instr->m_func);
    bVar2 = JITTimeFunctionBody::IsAsmJsMode(pJVar5);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x2dd,
                         "(instr->m_opcode == Js::OpCode::CheckFixedFld || instr->GetDst()->GetType() == TyVar || instr->m_func->GetJITFunctionBody()->IsAsmJsMode())"
                         ,
                         "instr->m_opcode == Js::OpCode::CheckFixedFld || instr->GetDst()->GetType() == TyVar || instr->m_func->GetJITFunctionBody()->IsAsmJsMode()"
                        );
      if (!bVar2) goto LAB_0046b58e;
      *puVar4 = 0;
    }
  }
  if (instr->m_src1->m_type != TyVar) {
    pJVar5 = Func::GetJITFunctionBody(instr->m_func);
    bVar2 = JITTimeFunctionBody::IsAsmJsMode(pJVar5);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x2de,
                         "(instr->GetSrc1()->GetType() == TyVar || instr->m_func->GetJITFunctionBody()->IsAsmJsMode())"
                         ,
                         "instr->GetSrc1()->GetType() == TyVar || instr->m_func->GetJITFunctionBody()->IsAsmJsMode()"
                        );
      if (!bVar2) goto LAB_0046b58e;
      *puVar4 = 0;
    }
  }
  pSVar6 = IR::Opnd::AsSymOpnd(instr->m_src1);
  if (pSVar6->m_sym->m_kind != SymKindProperty) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x2df,"(instr->GetSrc1()->AsSymOpnd()->m_sym->IsPropertySym())",
                       "instr->GetSrc1()->AsSymOpnd()->m_sym->IsPropertySym()");
    if (!bVar2) goto LAB_0046b58e;
    *puVar4 = 0;
  }
  if (instr->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x2e0,"(instr->GetSrc2() == nullptr)","instr->GetSrc2() == nullptr");
    if (!bVar2) {
LAB_0046b58e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

void
GlobOpt::AssertCanCopyPropOrCSEFieldLoad(IR::Instr * instr)
{
    // Consider: Hoisting LdRootFld may have complication with exception if the field doesn't exist.
    // We need to have another opcode for the hoisted version to avoid the exception and bailout.

    Assert(instr->m_opcode == Js::OpCode::LdSlot || instr->m_opcode == Js::OpCode::LdSlotArr
        || instr->m_opcode == Js::OpCode::LdFld || instr->m_opcode == Js::OpCode::LdFldForCallApplyTarget
        || instr->m_opcode == Js::OpCode::LdLen_A
        || instr->m_opcode == Js::OpCode::LdRootFld  || instr->m_opcode == Js::OpCode::LdSuperFld
        || instr->m_opcode == Js::OpCode::LdFldForTypeOf || instr->m_opcode == Js::OpCode::LdRootFldForTypeOf
        || instr->m_opcode == Js::OpCode::LdMethodFld || instr->m_opcode == Js::OpCode::LdMethodFldPolyInlineMiss
        || instr->m_opcode == Js::OpCode::LdRootMethodFld
        || instr->m_opcode == Js::OpCode::LdMethodFromFlags
        || instr->m_opcode == Js::OpCode::ScopedLdMethodFld
        || instr->m_opcode == Js::OpCode::CheckFixedFld
        || instr->m_opcode == Js::OpCode::CheckPropertyGuardAndLoadType
        || instr->m_opcode == Js::OpCode::ScopedLdFld
        || instr->m_opcode == Js::OpCode::ScopedLdFldForTypeOf);

    Assert(instr->m_opcode == Js::OpCode::CheckFixedFld || instr->GetDst()->GetType() == TyVar || instr->m_func->GetJITFunctionBody()->IsAsmJsMode());
    Assert(instr->GetSrc1()->GetType() == TyVar || instr->m_func->GetJITFunctionBody()->IsAsmJsMode());
    Assert(instr->GetSrc1()->AsSymOpnd()->m_sym->IsPropertySym());
    Assert(instr->GetSrc2() == nullptr);
}